

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCorrFunc.cpp
# Opt level: O0

void __thiscall
OpenMD::TimeCorrFunc<OpenMD::Vector<double,_4U>_>::postCorrelate
          (TimeCorrFunc<OpenMD::Vector<double,_4U>_> *this)

{
  reference pvVar1;
  Vector<double,_4U> *in_RDI;
  double s;
  uint i;
  Vector<double,_4U> zeroType;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar2;
  double local_30;
  Vector<double,_4U> local_28;
  
  local_30 = 0.0;
  Vector<double,_4U>::Vector(&local_28,&local_30);
  for (uVar2 = 0; uVar2 < *(uint *)(in_RDI[1].data_ + 3); uVar2 = uVar2 + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI[2].data_ + 3),(ulong)uVar2);
    if (*pvVar1 < 1) {
      std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>::
      operator[]((vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_> *
                 )(in_RDI + 2),(ulong)uVar2);
      Vector<double,_4U>::operator=
                ((Vector<double,_4U> *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),in_RDI);
    }
    else {
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI[2].data_ + 3),(ulong)uVar2);
      s = (double)*pvVar1;
      std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>::
      operator[]((vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_> *
                 )(in_RDI + 2),(ulong)uVar2);
      Vector<double,_4U>::operator/=(in_RDI,s);
    }
  }
  return;
}

Assistant:

void TimeCorrFunc<T>::postCorrelate() {
    T zeroType(0.0);
    for (unsigned int i = 0; i < nTimeBins_; ++i) {
      if (count_[i] > 0) {
        histogram_[i] /= count_[i];
      } else {
        histogram_[i] = zeroType;
      }
    }
  }